

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink.c
# Opt level: O2

dynlink dynlink_load(dynlink_path path,dynlink_name name,dynlink_flags flags)

{
  dynlink handle;
  size_t sVar1;
  size_t sVar2;
  size_t path_size;
  dynlink_impl pvVar3;
  dynlink_name_impl name_impl;
  dynlink_name_impl join_path;
  char acStack_2038 [4096];
  char local_1038 [4104];
  
  if ((name != (dynlink_name)0x0) && (handle = (dynlink)malloc(0x2010), handle != (dynlink)0x0)) {
    strncpy((char *)handle,name,0xfff);
    dynlink_impl_get_name((dynlink_name)handle,acStack_2038,0x1000);
    if (path == (dynlink_path)0x0) {
      sVar1 = strnlen(acStack_2038,0x1000);
      strncpy(handle->name_impl,acStack_2038,sVar1 + 1);
    }
    else {
      sVar1 = strnlen(path,0x1000);
      sVar2 = strnlen(acStack_2038,0x1000);
      path_size = portability_path_join(path,sVar1 + 1,acStack_2038,sVar2 + 1,local_1038,0x1000);
      portability_path_canonical(local_1038,path_size,handle->name_impl,0x1000);
    }
    handle->flags = flags;
    pvVar3 = dynlink_impl_load(handle);
    handle->impl = pvVar3;
    if (pvVar3 != (dynlink_impl)0x0) {
      return handle;
    }
    free(handle);
  }
  return (dynlink)0x0;
}

Assistant:

dynlink dynlink_load(dynlink_path path, dynlink_name name, dynlink_flags flags)
{
	if (name != NULL)
	{
		dynlink handle = malloc(sizeof(struct dynlink_type));

		if (handle != NULL)
		{
			dynlink_name_impl name_impl;

			strncpy(handle->name, name, PORTABILITY_PATH_SIZE - 1);

			dynlink_impl_get_name(dynlink_get_name(handle), name_impl, PORTABILITY_PATH_SIZE);

			if (path != NULL)
			{
				dynlink_name_impl join_path;

				size_t join_path_size = portability_path_join(path, strnlen(path, PORTABILITY_PATH_SIZE) + 1, name_impl, strnlen(name_impl, PORTABILITY_PATH_SIZE) + 1, join_path, PORTABILITY_PATH_SIZE);

				(void)portability_path_canonical(join_path, join_path_size, handle->name_impl, PORTABILITY_PATH_SIZE);
			}
			else
			{
				strncpy(handle->name_impl, name_impl, strnlen(name_impl, PORTABILITY_PATH_SIZE) + 1);
			}

			handle->flags = flags;

			handle->impl = dynlink_impl_load(handle);

			if (handle->impl != NULL)
			{
				return handle;
			}

			free(handle);
		}
	}

	return NULL;
}